

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

uint32_t ranged_random(uint32_t range)

{
  uint32_t uVar1;
  uint in_EDI;
  uint32_t threshold;
  uint32_t leftover;
  uint64_t multiresult;
  uint64_t random32bit;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 local_10;
  undefined4 local_4;
  
  uVar1 = pcg32_random();
  local_10 = (ulong)uVar1;
  if ((in_EDI & in_EDI - 1) == 0) {
    local_4 = uVar1 & in_EDI - 1;
  }
  else if (in_EDI < 0x80000001) {
    local_18 = local_10 * in_EDI;
    local_1c = (uint)local_18;
    if (local_1c < in_EDI) {
      while (local_1c <= (uint)(0xffffffff % (ulong)in_EDI)) {
        uVar1 = pcg32_random();
        local_18 = (ulong)uVar1 * (ulong)in_EDI;
        local_1c = (uint)local_18;
      }
    }
    local_4 = (uint)((ulong)local_18 >> 0x20);
  }
  else {
    while (in_EDI <= local_10) {
      uVar1 = pcg32_random();
      local_10 = (ulong)uVar1;
    }
    local_4 = (uint)local_10;
  }
  return local_4;
}

Assistant:

static inline uint32_t ranged_random(uint32_t range) {
    uint64_t random32bit, multiresult;
    uint32_t leftover;
    uint32_t threshold;
    random32bit = pcg32_random();
    if ((range & (range - 1)) == 0) {
        return random32bit & (range - 1);
    }
    if (range > 0x80000000) {  // if range > 1<<31
        while (random32bit >= range) {
            random32bit = pcg32_random();
        }
        return (uint32_t)random32bit;  // [0, range)
    }
    multiresult = random32bit * range;
    leftover = (uint32_t)multiresult;
    if (leftover < range) {
        threshold = 0xFFFFFFFF % range;
        while (leftover <= threshold) {
            random32bit = pcg32_random();
            multiresult = random32bit * range;
            leftover = (uint32_t)multiresult;
        }
    }
    return multiresult >> 32;  // [0, range)
}